

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

int TPZShapeHDiv<pzshape::TPZShapePrism>::NShapeF(TPZShapeData *shapedata)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = (uint)(shapedata->fHDivNumConnectShape).super_TPZVec<int>.fNElements;
  uVar4 = 0;
  uVar3 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar3 = uVar4;
  }
  iVar2 = 0;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    iVar2 = iVar2 + (shapedata->fHDivNumConnectShape).super_TPZVec<int>.fStore[uVar4];
  }
  return iVar2;
}

Assistant:

inline int64_t size() const { return fNElements; }